

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceMappingBase.cpp
# Opt level: O3

IDeviceObject * __thiscall
Diligent::ResourceMappingImpl::GetResource(ResourceMappingImpl *this,Char *Name,Uint32 ArrayIndex)

{
  SpinLock *this_00;
  byte bVar1;
  __node_base_ptr p_Var2;
  _Hash_node_base *p_Var3;
  string msg;
  string local_50;
  
  if ((Name == (Char *)0x0) || (*Name == '\0')) {
    FormatString<char[31]>(&local_50,(char (*) [31])"Name must not be null or empty");
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"GetResource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/ResourceMappingBase.cpp"
               ,0x56);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    p_Var3 = (_Hash_node_base *)0x0;
  }
  else {
    this_00 = &this->m_Lock;
    LOCK();
    bVar1 = (this->m_Lock).m_IsLocked._M_base._M_i;
    (this->m_Lock).m_IsLocked._M_base._M_i = true;
    UNLOCK();
    while ((bVar1 & 1) != 0) {
      Threading::SpinLock::Wait(this_00);
      LOCK();
      bVar1 = (this_00->m_IsLocked)._M_base._M_i;
      (this_00->m_IsLocked)._M_base._M_i = true;
      UNLOCK();
    }
    ResMappingHashKey::ResMappingHashKey((ResMappingHashKey *)&local_50,Name,false,ArrayIndex);
    p_Var2 = std::
             _Hashtable<Diligent::ResourceMappingImpl::ResMappingHashKey,_std::pair<const_Diligent::ResourceMappingImpl::ResMappingHashKey,_Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>,_Diligent::STDAllocator<std::pair<const_Diligent::ResourceMappingImpl::ResMappingHashKey,_Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>,_Diligent::IMemoryAllocator>,_std::__detail::_Select1st,_std::equal_to<Diligent::ResourceMappingImpl::ResMappingHashKey>,_Diligent::HashMapStringKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::_M_find_before_node
                       (&(this->m_HashTable)._M_h,
                        (local_50._M_string_length & 0x7fffffffffffffff) %
                        (this->m_HashTable)._M_h._M_bucket_count,(key_type *)&local_50,
                        local_50._M_string_length & 0x7fffffffffffffff);
    if (p_Var2 == (__node_base_ptr)0x0) {
      p_Var3 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var3 = p_Var2->_M_nxt;
    }
    if ((local_50._M_dataplus._M_p != (Char *)0x0) && ((long)local_50._M_string_length < 0)) {
      operator_delete__(local_50._M_dataplus._M_p);
    }
    if (p_Var3 == (_Hash_node_base *)0x0) {
      p_Var3 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var3 = p_Var3[4]._M_nxt;
    }
    Threading::SpinLock::unlock(this_00);
  }
  return (IDeviceObject *)p_Var3;
}

Assistant:

IDeviceObject* ResourceMappingImpl::GetResource(const Char* Name, Uint32 ArrayIndex)
{
    if (Name == nullptr || *Name == '\0')
    {
        DEV_ERROR("Name must not be null or empty");
        return nullptr;
    }

    Threading::SpinLockGuard Guard{m_Lock};

    // Find an object with the requested name
    auto It = m_HashTable.find(ResMappingHashKey{Name, false, ArrayIndex});
    return It != m_HashTable.end() ? It->second.RawPtr() : nullptr;
}